

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O2

string * Liby::http::getMimeType(string *__return_storage_ptr__,string *uri)

{
  pointer pcVar1;
  long lVar2;
  iterator iVar3;
  allocator local_51;
  string type;
  string ret;
  
  ret._M_dataplus._M_p = (pointer)&ret.field_2;
  ret._M_string_length = 0;
  ret.field_2._M_local_buf[0] = '\0';
  lVar2 = std::__cxx11::string::rfind((char)uri,0x2e);
  if (lVar2 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"text/plain",(allocator *)&type);
  }
  else {
    pcVar1 = (uri->_M_dataplus)._M_p;
    type._M_dataplus._M_p = (pointer)&type.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&type,pcVar1 + lVar2,pcVar1 + uri->_M_string_length);
    iVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&file_mime_abi_cxx11_._M_h,&type);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"text/plain",&local_51);
    }
    else {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 (string *)
                 ((long)iVar3.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        ._M_cur + 0x28));
    }
    std::__cxx11::string::~string((string *)&type);
  }
  std::__cxx11::string::~string((string *)&ret);
  return __return_storage_ptr__;
}

Assistant:

std::string Liby::http::getMimeType(const std::string &uri) {
    std::string ret;
    unsigned long ops;
    ops = uri.rfind('.');
    if (ops == std::string::npos) {
        return "text/plain";
    } else {
        std::string type(&uri[ops], &uri[uri.size()]);
        auto it = file_mime.find(type);
        if (it == file_mime.end()) {
            return "text/plain";
        } else {
            return it->second;
        }
    }
}